

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

TxSize wallet::CalculateMaximumSignedTxSize
                 (CTransaction *tx,CWallet *wallet,CCoinControl *coin_control)

{
  pointer pCVar1;
  long lVar2;
  const_iterator cVar3;
  const_reference __args;
  pointer outpoint;
  ulong __n;
  long in_FS_OFFSET;
  TxSize TVar4;
  vector<CTxOut,_std::allocator<CTxOut>_> txouts;
  _Optional_payload_base<CTxOut> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  txouts.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  txouts.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  txouts.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  outpoint = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
  pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (outpoint == pCVar1) {
      TVar4 = CalculateMaximumSignedTxSize(tx,wallet,&txouts,coin_control);
LAB_0097d34f:
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txouts);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return TVar4;
      }
      __stack_chk_fail();
    }
    cVar3 = std::
            _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(wallet->mapWallet)._M_h,(key_type *)outpoint);
    if (cVar3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur ==
        (__node_type *)0x0) {
      if (coin_control != (CCoinControl *)0x0) {
        CCoinControl::GetExternalOutput
                  ((optional<CTxOut> *)&local_68,coin_control,&outpoint->prevout);
        if (local_68._M_engaged != false) {
          std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<CTxOut_const&>
                    ((vector<CTxOut,std::allocator<CTxOut>> *)&txouts,(CTxOut *)&local_68);
          std::_Optional_payload_base<CTxOut>::_M_reset(&local_68);
          goto LAB_0097d318;
        }
        std::_Optional_payload_base<CTxOut>::_M_reset(&local_68);
      }
      TVar4.weight = -1;
      TVar4.vsize = -1;
      goto LAB_0097d34f;
    }
    __n = (ulong)(outpoint->prevout).n;
    lVar2 = *(long *)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                            ._M_cur + 0x1c0);
    if ((ulong)((*(long *)(lVar2 + 0x20) - *(long *)(lVar2 + 0x18)) / 0x28) <= __n) {
      __assert_fail("input.prevout.n < mi->second.tx->vout.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/spend.cpp"
                    ,0xae,
                    "TxSize wallet::CalculateMaximumSignedTxSize(const CTransaction &, const CWallet *, const CCoinControl *)"
                   );
    }
    __args = std::vector<CTxOut,_std::allocator<CTxOut>_>::at
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)(lVar2 + 0x18),__n);
    std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<CTxOut_const&>
              ((vector<CTxOut,std::allocator<CTxOut>> *)&txouts,__args);
LAB_0097d318:
    outpoint = outpoint + 1;
  } while( true );
}

Assistant:

TxSize CalculateMaximumSignedTxSize(const CTransaction &tx, const CWallet *wallet, const CCoinControl* coin_control)
{
    std::vector<CTxOut> txouts;
    // Look up the inputs. The inputs are either in the wallet, or in coin_control.
    for (const CTxIn& input : tx.vin) {
        const auto mi = wallet->mapWallet.find(input.prevout.hash);
        // Can not estimate size without knowing the input details
        if (mi != wallet->mapWallet.end()) {
            assert(input.prevout.n < mi->second.tx->vout.size());
            txouts.emplace_back(mi->second.tx->vout.at(input.prevout.n));
        } else if (coin_control) {
            const auto& txout{coin_control->GetExternalOutput(input.prevout)};
            if (!txout) return TxSize{-1, -1};
            txouts.emplace_back(*txout);
        } else {
            return TxSize{-1, -1};
        }
    }
    return CalculateMaximumSignedTxSize(tx, wallet, txouts, coin_control);
}